

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall
GlobOpt::IsOperationThatLikelyKillsJsArraysWithNoMissingValues(GlobOpt *this,Instr *instr)

{
  bool bVar1;
  ProfiledInstr *pPVar2;
  bool local_21;
  Instr *instr_local;
  GlobOpt *this_local;
  
  if ((instr->m_opcode == StElemI_A) || (local_21 = false, instr->m_opcode == StElemI_A_Strict)) {
    bVar1 = DoArrayMissingValueCheckHoist(this);
    local_21 = false;
    if (bVar1) {
      bVar1 = IR::Instr::IsProfiledInstr(instr);
      local_21 = false;
      if (bVar1) {
        pPVar2 = IR::Instr::AsProfiledInstr(instr);
        local_21 = Js::StElemInfo::LikelyCreatesMissingValue((pPVar2->u).stElemInfo);
      }
    }
  }
  return local_21;
}

Assistant:

bool
GlobOpt::IsOperationThatLikelyKillsJsArraysWithNoMissingValues(IR::Instr *const instr)
{
    // StElem is profiled with information indicating whether it will likely create a missing value in the array. In that case,
    // we prefer to kill the no-missing-values information in the value so that we don't bail out in a likely circumstance.
    return
        (instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict) &&
        DoArrayMissingValueCheckHoist() &&
        instr->IsProfiledInstr() &&
        instr->AsProfiledInstr()->u.stElemInfo->LikelyCreatesMissingValue();
}